

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O2

void emit_dht(j_compress_ptr cinfo,int index,boolean is_ac)

{
  JHUFF_TBL *pJVar1;
  jpeg_error_mgr *pjVar2;
  int val;
  JHUFF_TBL **ppJVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  
  val = index;
  ppJVar3 = cinfo->dc_huff_tbl_ptrs;
  if (is_ac != 0) {
    val = index + 0x10;
    ppJVar3 = cinfo->ac_huff_tbl_ptrs;
  }
  pJVar1 = ppJVar3[index];
  if (pJVar1 == (JHUFF_TBL *)0x0) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x34;
    (pjVar2->msg_parm).i[0] = val;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if (pJVar1->sent_table == 0) {
    emit_marker(cinfo,M_DHT);
    uVar5 = 0;
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
      uVar5 = uVar5 + pJVar1->bits[lVar4 + 1];
    }
    emit_2bytes(cinfo,uVar5 + 0x13);
    emit_byte(cinfo,val);
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
      emit_byte(cinfo,(uint)pJVar1->bits[lVar4 + 1]);
    }
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      emit_byte(cinfo,(uint)pJVar1->huffval[uVar6]);
    }
    pJVar1->sent_table = 1;
  }
  return;
}

Assistant:

LOCAL(void)
emit_dht (j_compress_ptr cinfo, int index, boolean is_ac)
/* Emit a DHT marker */
{
  JHUFF_TBL * htbl;
  int length, i;
  
  if (is_ac) {
    htbl = cinfo->ac_huff_tbl_ptrs[index];
    index += 0x10;		/* output index has AC bit set */
  } else {
    htbl = cinfo->dc_huff_tbl_ptrs[index];
  }

  if (htbl == NULL)
    ERREXIT1(cinfo, JERR_NO_HUFF_TABLE, index);
  
  if (! htbl->sent_table) {
    emit_marker(cinfo, M_DHT);
    
    length = 0;
    for (i = 1; i <= 16; i++)
      length += htbl->bits[i];
    
    emit_2bytes(cinfo, length + 2 + 1 + 16);
    emit_byte(cinfo, index);
    
    for (i = 1; i <= 16; i++)
      emit_byte(cinfo, htbl->bits[i]);
    
    for (i = 0; i < length; i++)
      emit_byte(cinfo, htbl->huffval[i]);
    
    htbl->sent_table = TRUE;
  }
}